

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::saveBinaryFile(ObjLoader *this,string *filename)

{
  bool bVar1;
  char *pcVar2;
  Image<unsigned_char> *pIVar3;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  size_t __n_04;
  size_t __n_05;
  size_t __n_06;
  size_t __n_07;
  size_t __n_08;
  size_t __n_09;
  size_t __n_10;
  size_t __n_11;
  size_t __n_12;
  size_t __n_13;
  allocator<char> local_461;
  string local_460 [32];
  reference local_440;
  SimpleMaterial *material;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *__range1_2;
  string local_418 [32];
  int local_3f8;
  int local_3f4;
  int32 c;
  int32 d;
  int32 h;
  int32 w;
  Image<unsigned_char> image;
  allocator<char> local_3c1;
  string local_3c0 [32];
  reference local_3a0;
  string *name;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textureImageNames;
  string local_360 [32];
  reference local_340;
  IBO *ibo;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint64_t count;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [48];
  ostream local_218 [8];
  ofstream file;
  string *filename_local;
  ObjLoader *this_local;
  
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (filename);
  std::ofstream::ofstream(local_218,pcVar2,0x10);
  std::ostream::write((char *)local_218,0x1bd1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"[VertexPositions]",&local_249);
  write((int)local_248,local_218,__n);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexPositions,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"[VertexColors]",&local_271);
  write((int)local_270,local_218,__n_00);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  write<glm::vec<4,float,(glm::qualifier)0>>(&this->m_vertexColors,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"[VertexUVs]",&local_299);
  write((int)local_298,local_218,__n_01);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  write<glm::vec<2,float,(glm::qualifier)0>>(&this->m_vertexUVs,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"[VertexNormals]",&local_2c1);
  write((int)local_2c0,local_218,__n_02);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexNormals,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"[VertexTangents]",&local_2e9);
  write((int)local_2e8,local_218,__n_03);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexTangents,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,"[IBOS]",(allocator<char> *)((long)&count + 7));
  write((int)local_310,local_218,__n_04);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 7));
  __range1 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(&this->m_ibos);
  write<unsigned_long>((unsigned_long *)&__range1,local_218);
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(&this->m_ibos);
  ibo = (IBO *)std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::end(&this->m_ibos);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      (&__end1,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&ibo);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_340 = __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator*(&__end1);
    write<unsigned_int>(local_340,local_218);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"[NamedTextureImages]",
             (allocator<char> *)
             ((long)&textureImageNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  write((int)local_360,local_218,__n_05);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&textureImageNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  NamedTextureImages::names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_1,&this->m_images);
  __range1 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1_1);
  write<unsigned_long>((unsigned_long *)&__range1,local_218);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  name = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1_1);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&name);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_3a0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3c0,"_Image_",&local_3c1);
    write((int)local_3c0,local_218,__n_06);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    write((int)local_3a0,local_218,__n_07);
    pIVar3 = NamedTextureImages::operator[](&this->m_images,local_3a0);
    image._8_8_ = pIVar3->data;
    h = pIVar3->width;
    unique0x100006da = pIVar3->height;
    image.width = pIVar3->depth;
    image.height = pIVar3->channels;
    d = h;
    c = unique0x100006da;
    local_3f4 = image.width;
    local_3f8 = image.height;
    write<int>(&d,local_218);
    write<int>(&c,local_218);
    write<int>(&local_3f4,local_218);
    write<int>(&local_3f8,local_218);
    std::ostream::write((char *)local_218,image._8_8_);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"[SimpleMaterials]",(allocator<char> *)((long)&__range1_2 + 7));
  write((int)local_418,local_218,__n_08);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
  __range1 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::size
                          (&this->m_materials);
  write<unsigned_long>((unsigned_long *)&__range1,local_218);
  __end1_2 = std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::begin(&this->m_materials)
  ;
  material = (SimpleMaterial *)
             std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::end(&this->m_materials);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
                      (&__end1_2,
                       (__normal_iterator<const_SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
                        *)&material);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_440 = __gnu_cxx::
                __normal_iterator<const_SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
                ::operator*(&__end1_2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_460,"_Material_",&local_461);
    write((int)local_460,local_218,__n_09);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator(&local_461);
    write((int)local_440,local_218,__n_10);
    write<glm::vec<3,float,(glm::qualifier)0>>(&local_440->ambient,local_218);
    write<glm::vec<3,float,(glm::qualifier)0>>(&local_440->diffuse,local_218);
    write<glm::vec<3,float,(glm::qualifier)0>>(&local_440->specular,local_218);
    write<float>(&local_440->shininess,local_218);
    write((int)local_440 + 0x48,local_218,__n_11);
    write((int)local_440 + 0x68,local_218,__n_12);
    write((int)local_440 + 0x88,local_218,__n_13);
    __gnu_cxx::
    __normal_iterator<const_SimpleMaterial_*,_std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>_>
    ::operator++(&__end1_2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void ObjLoader::saveBinaryFile(const std::string & filename) const
{
#define GLITTER_BINFILE_MAGIC "GLITTER_BIN_OBJ\n"
  std::ofstream file(filename.c_str());
  file.write(GLITTER_BINFILE_MAGIC, strlen(GLITTER_BINFILE_MAGIC));

  write(std::string("[VertexPositions]"), file);
  write(m_vertexPositions, file);
  write(std::string("[VertexColors]"), file);
  write(m_vertexColors, file);
  write(std::string("[VertexUVs]"), file);
  write(m_vertexUVs, file);
  write(std::string("[VertexNormals]"), file);
  write(m_vertexNormals, file);
  write(std::string("[VertexTangents]"), file);
  write(m_vertexTangents, file);

  write(std::string("[IBOS]"), file);
  // IBOs
  std::uint64_t count = m_ibos.size();
  write(count, file);
  for (const IBO & ibo : m_ibos) {
    write(ibo, file);
  }

  write(std::string("[NamedTextureImages]"), file);
  // NamedTextureImages m_images;
  std::vector<std::string> textureImageNames = m_images.names();
  count = textureImageNames.size();
  write(count, file);
  for (const std::string & name : textureImageNames) {
    write(std::string("_Image_"), file);
    write(name, file);
    Image<> image = m_images[name];
    glm::int32 w = image.width;
    glm::int32 h = image.height;
    glm::int32 d = image.depth;
    glm::int32 c = image.channels;
    write(w, file);
    write(h, file);
    write(d, file);
    write(c, file);
    file.write(reinterpret_cast<const char *>(image.data), w * h * d * c);
  }

  write(std::string("[SimpleMaterials]"), file);
  // std::vector<SimpleMaterial> m_materials;
  count = m_materials.size();
  write(count, file);
  for (const SimpleMaterial & material : m_materials) {
    write(std::string("_Material_"), file);
    write(material.name, file);
    write(material.ambient, file);
    write(material.diffuse, file);
    write(material.specular, file);
    write(material.shininess, file);
    write(material.diffuseTexName, file);
    write(material.normalTexName, file);
    write(material.specularTexName, file);
  }
}